

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_grid.hpp
# Opt level: O0

ostream * multidim::_impl_multi_grid::operator<<(ostream *os,Grid<float,_4UL,_2UL,_3UL> *rhs)

{
  const_iterator __last;
  ostream_iterator<float,_char,_std::char_traits<char>_> *__result;
  ostream *poVar1;
  iterator __last_00;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *__result_00;
  size_type sVar2;
  unsigned_long local_78 [2];
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  ArrayCoord coord;
  size_t idx;
  ostream_iterator<float,_char,_std::char_traits<char>_> local_28;
  array<float,_24UL> *local_18;
  Grid<float,_4UL,_2UL,_3UL> *rhs_local;
  ostream *os_local;
  
  local_18 = &rhs->values_;
  rhs_local = (Grid<float,_4UL,_2UL,_3UL> *)os;
  std::operator<<(os,"Values : [ ");
  __last = array<float,_24UL>::begin(local_18);
  __result = (ostream_iterator<float,_char,_std::char_traits<char>_> *)
             array<float,_24UL>::end(local_18);
  std::ostream_iterator<float,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_28,(ostream_type *)rhs_local," ");
  std::copy<float_const*,std::ostream_iterator<float,char,std::char_traits<char>>>
            ((float *)&idx,__last,__result);
  std::operator<<((ostream *)rhs_local,"]\nMapping index to coord :\n");
  for (coord.data_[2] = 0; coord.data_[2] < 0x18; coord.data_[2] = coord.data_[2] + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(rhs_local,coord.data_[2]);
    std::operator<<(poVar1,":{");
    Grid<float,_4UL,_2UL,_3UL>::unflatten
              ((ArrayCoord *)local_58,(Grid<float,_4UL,_2UL,_3UL> *)local_18,coord.data_[2]);
    __last_00 = array<unsigned_long,_3UL>::begin((array<unsigned_long,_3UL> *)local_58);
    __result_00 = (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
                  array<unsigned_long,_3UL>::end((array<unsigned_long,_3UL> *)local_58);
    std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_68,(ostream_type *)rhs_local,",");
    std::copy<unsigned_long*,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
              (local_78,__last_00,__result_00);
    poVar1 = std::operator<<((ostream *)rhs_local,"}:");
    sVar2 = Grid<float,_4UL,_2UL,_3UL>::flatten
                      ((Grid<float,_4UL,_2UL,_3UL> *)local_18,(ArrayCoord *)local_58);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    std::operator<<(poVar1,' ');
  }
  return (ostream *)rhs_local;
}

Assistant:

auto& operator<<(std::ostream &os, const Grid& rhs) 
    {
        os << "Values : [ ";
        std::copy(rhs.values_.begin(), rhs.values_.end(), 
            std::ostream_iterator<typename Grid::value_type>(os, " "));

        os << "]\nMapping index to coord :\n";
        for(size_t idx = 0; idx < rhs.prod_dims; idx ++) {
            os << idx << ":{";
            auto coord = rhs.unflatten(idx);
            std::copy(coord.begin(), coord.end(), 
                std::ostream_iterator<typename ArrayCoord::value_type>(os, ","));
            os << "}:" << rhs.flatten(coord) << ' ';
        }

        return os;
    }